

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void fmt::v10::detail::vformat_to<char>
               (buffer<char> *buf,basic_string_view<char> fmt,type args,locale_ref loc)

{
  short *to;
  size_t sVar1;
  undefined1 value [16];
  undefined1 value_00 [16];
  appender out;
  appender out_00;
  appender out_01;
  bool bVar2;
  type tVar3;
  short *end;
  short *psVar4;
  short *from;
  size_t __n;
  appender it;
  appender out_02;
  format_specs<char> specs;
  writer write;
  unkbyte10 in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff42;
  float local_b8;
  undefined4 uStack_b4;
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  default_arg_formatter<char> local_a0;
  undefined1 local_80 [24];
  appender local_68;
  unsigned_long_long local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_58;
  locale_ref local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_a0.args.field_1 = args.field_1;
  local_a0.args.desc_ = args.desc_;
  local_80._8_8_ = fmt.size_;
  from = (short *)fmt.data_;
  if ((local_80._8_8_ == 2) && (*from == 0x7d7b)) {
    if ((long)local_a0.args.desc_ < 0) {
      if ((int)(type)args.desc_ < 1) {
        tVar3 = none_type;
      }
      else {
        sVar1 = ((local_a0.args.field_1.values_)->field_0).string.size;
        local_b8 = (float)((local_a0.args.field_1.values_)->field_0).ulong_long_value;
        uStack_b4 = (undefined4)
                    (((local_a0.args.field_1.values_)->field_0).ulong_long_value >> 0x20);
        uStack_b0 = (undefined2)sVar1;
        uStack_ae = (undefined6)(sVar1 >> 0x10);
        tVar3 = (local_a0.args.field_1.args_)->type_;
      }
    }
    else {
      tVar3 = (type)args.desc_ & custom_type;
      if (((undefined1  [16])args & (undefined1  [16])0xf) != (undefined1  [16])0x0) {
        sVar1 = ((local_a0.args.field_1.values_)->field_0).string.size;
        local_b8 = (float)((local_a0.args.field_1.values_)->field_0).ulong_long_value;
        uStack_b4 = (undefined4)
                    (((local_a0.args.field_1.values_)->field_0).ulong_long_value >> 0x20);
        uStack_b0 = (undefined2)sVar1;
        uStack_ae = (undefined6)(sVar1 >> 0x10);
      }
    }
    if (tVar3 == none_type) {
      throw_format_error("argument not found");
    }
    local_a0.out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)buf;
    local_a0.loc.locale_ = loc.locale_;
    switch(tVar3) {
    case int_type:
      out_02.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ = 0;
      out_02.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ = local_b8;
      write<char,_fmt::v10::appender,_int,_0>((detail *)buf,out_02,0x175598);
      break;
    case uint_type:
      write<char,_fmt::v10::appender,_unsigned_int,_0>((appender)buf,(uint)local_b8);
      break;
    case long_long_type:
      out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ = uStack_b4
      ;
      out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ = local_b8;
      write<char,_fmt::v10::appender,_long_long,_0>((detail *)buf,out_00,0x175598);
      break;
    case ulong_long_type:
      write<char,_fmt::v10::appender,_unsigned_long_long,_0>
                ((appender)buf,CONCAT44(uStack_b4,local_b8));
      break;
    case int128_type:
      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ = uStack_b4;
      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ = local_b8;
      value._10_6_ = in_stack_ffffffffffffff42;
      value._0_10_ = in_stack_ffffffffffffff38;
      write<char,_fmt::v10::appender,___int128,_0>((detail *)buf,out,(__int128)value);
      break;
    case uint128_type:
      out_01.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._4_4_ = uStack_b4
      ;
      out_01.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_4_ = local_b8;
      value_00._10_6_ = in_stack_ffffffffffffff42;
      value_00._0_10_ = in_stack_ffffffffffffff38;
      write<char,_fmt::v10::appender,_unsigned___int128,_0>
                ((detail *)buf,out_01,(unsigned___int128)value_00);
      break;
    case bool_type:
      default_arg_formatter<char>::operator()(&local_a0,(bool)(local_b8._0_1_ & 1));
      break;
    case char_type:
      if (buf->capacity_ < buf->size_ + 1) {
        (**buf->_vptr_buffer)(buf);
      }
      sVar1 = buf->size_;
      buf->size_ = sVar1 + 1;
      buf->ptr_[sVar1] = local_b8._0_1_;
      break;
    case float_type:
      write<char,_fmt::v10::appender,_float,_0>((appender)buf,local_b8);
      break;
    case double_type:
      write<char,_fmt::v10::appender,_double,_0>((appender)buf,(double)CONCAT44(uStack_b4,local_b8))
      ;
      break;
    case last_numeric_type:
      specs.type = none;
      specs._9_2_ = 0;
      specs.fill.data_[0] = ' ';
      specs.fill.data_[1] = '\0';
      specs.fill.data_[2] = '\0';
      specs.fill.data_[3] = '\0';
      specs.fill.size_ = '\x01';
      specs.width = 0;
      specs.precision = -1;
      write<char,_fmt::v10::appender,_long_double,_0>
                ((appender)buf,(longdouble)CONCAT28(uStack_b0,CONCAT44(uStack_b4,local_b8)),specs,
                 (locale_ref)0x0);
      break;
    case cstring_type:
      write<char,fmt::v10::appender>((appender)buf,(char *)CONCAT44(uStack_b4,local_b8));
      break;
    case string_type:
      copy_str_noinline<char,char_const*,fmt::v10::appender>
                ((char *)CONCAT44(uStack_b4,local_b8),
                 (char *)CONCAT44(uStack_b4,local_b8) + CONCAT62(uStack_ae,uStack_b0),(appender)buf)
      ;
      break;
    case pointer_type:
      default_arg_formatter<char>::operator()(&local_a0,(void *)CONCAT44(uStack_b4,local_b8));
      break;
    case custom_type:
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      local_80._0_8_ = buf;
      local_80._8_8_ = local_a0.args.desc_;
      local_80._16_8_ = local_a0.args.field_1;
      local_68.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v10::detail::buffer<char>_>)loc.locale_;
      (*(code *)CONCAT62(uStack_ae,uStack_b0))(CONCAT44(uStack_b4,local_b8));
      break;
    default:
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/format.h"
                  ,0xe5a,"");
    }
  }
  else {
    local_80._16_8_ = local_80._16_8_ & 0xffffffff00000000;
    to = (short *)((long)from + local_80._8_8_);
    local_80._0_8_ = from;
    local_68.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)buf;
    local_60 = local_a0.args.desc_;
    local_58 = local_a0.args.field_1;
    local_50.locale_ = loc.locale_;
    if ((long)local_80._8_8_ < 0x20) {
      if (local_80._8_8_ != 0) {
        psVar4 = from;
        do {
          end = (short *)((long)psVar4 + 1);
          if ((char)*psVar4 == '}') {
            if ((end == to) || (*(char *)end != '}')) {
              throw_format_error("unmatched \'}\' in format string");
            }
            vformat_to<char>::format_handler::on_text
                      ((format_handler *)local_80,(char *)from,(char *)end);
            end = psVar4 + 1;
            from = end;
          }
          else if ((char)*psVar4 == '{') {
            vformat_to<char>::format_handler::on_text
                      ((format_handler *)local_80,(char *)from,(char *)psVar4);
            end = (short *)parse_replacement_field<char,fmt::v10::detail::vformat_to<char>(fmt::v10::detail::buffer<char>&,fmt::v10::basic_string_view<char>,fmt::v10::detail::vformat_args<char>::type,fmt::v10::detail::locale_ref)::format_handler&>
                                     ((char *)psVar4,(char *)to,(format_handler *)local_80);
            from = end;
          }
          psVar4 = end;
        } while (end != to);
      }
      vformat_to<char>::format_handler::on_text((format_handler *)local_80,(char *)from,(char *)to);
    }
    else {
      local_a0.out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
           (back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_80;
      do {
        if (from == to) {
          return;
        }
        psVar4 = from;
        if ((char)*from == '{') {
LAB_0015d58b:
          parse_format_string<false,_char,_format_handler>::writer::operator()
                    ((writer *)&local_a0,(char *)from,(char *)psVar4);
          from = (short *)parse_replacement_field<char,fmt::v10::detail::vformat_to<char>(fmt::v10::detail::buffer<char>&,fmt::v10::basic_string_view<char>,fmt::v10::detail::vformat_args<char>::type,fmt::v10::detail::locale_ref)::format_handler&>
                                    ((char *)psVar4,(char *)to,(format_handler *)local_80);
          bVar2 = true;
        }
        else {
          __n = (long)to - ((long)from + 1);
          if ((long)__n < 0) {
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/core.h"
                        ,0x17a,"negative value");
          }
          psVar4 = (short *)memchr((void *)((long)from + 1),0x7b,__n);
          if (psVar4 != (short *)0x0) goto LAB_0015d58b;
          parse_format_string<false,_char,_format_handler>::writer::operator()
                    ((writer *)&local_a0,(char *)from,(char *)to);
          bVar2 = false;
        }
      } while (bVar2);
    }
  }
  return;
}

Assistant:

void vformat_to(buffer<Char>& buf, basic_string_view<Char> fmt,
                typename vformat_args<Char>::type args, locale_ref loc) {
  auto out = buffer_appender<Char>(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<Char>{out, args, loc}, arg);
    return;
  }

  struct format_handler : error_handler {
    basic_format_parse_context<Char> parse_context;
    buffer_context<Char> context;

    format_handler(buffer_appender<Char> p_out, basic_string_view<Char> str,
                   basic_format_args<buffer_context<Char>> p_args,
                   locale_ref p_loc)
        : parse_context(str), context(p_out, p_args, p_loc) {}

    void on_text(const Char* begin, const Char* end) {
      auto text = basic_string_view<Char>(begin, to_unsigned(end - begin));
      context.advance_to(write<Char>(context.out(), text));
    }

    FMT_CONSTEXPR auto on_arg_id() -> int {
      return parse_context.next_arg_id();
    }
    FMT_CONSTEXPR auto on_arg_id(int id) -> int {
      return parse_context.check_arg_id(id), id;
    }
    FMT_CONSTEXPR auto on_arg_id(basic_string_view<Char> id) -> int {
      int arg_id = context.arg_id(id);
      if (arg_id < 0) on_error("argument not found");
      return arg_id;
    }

    FMT_INLINE void on_replacement_field(int id, const Char*) {
      auto arg = get_arg(context, id);
      context.advance_to(visit_format_arg(
          default_arg_formatter<Char>{context.out(), context.args(),
                                      context.locale()},
          arg));
    }

    auto on_format_specs(int id, const Char* begin, const Char* end)
        -> const Char* {
      auto arg = get_arg(context, id);
      if (arg.type() == type::custom_type) {
        parse_context.advance_to(begin);
        visit_format_arg(custom_formatter<Char>{parse_context, context}, arg);
        return parse_context.begin();
      }
      auto specs = detail::dynamic_format_specs<Char>();
      begin = parse_format_specs(begin, end, specs, parse_context, arg.type());
      detail::handle_dynamic_spec<detail::width_checker>(
          specs.width, specs.width_ref, context);
      detail::handle_dynamic_spec<detail::precision_checker>(
          specs.precision, specs.precision_ref, context);
      if (begin == end || *begin != '}')
        on_error("missing '}' in format string");
      auto f = arg_formatter<Char>{context.out(), specs, context.locale()};
      context.advance_to(visit_format_arg(f, arg));
      return begin;
    }
  };
  detail::parse_format_string<false>(fmt, format_handler(out, fmt, args, loc));
}